

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O0

int anon_unknown.dwarf_2ffb82::makeUnixOpenFlags(uint oflag)

{
  uint local_10;
  int sysFlags;
  uint oflag_local;
  
  local_10 = 0;
  if ((oflag & 2) != 0) {
    if ((oflag & 1) == 0) {
      local_10 = 0x201;
    }
    else {
      local_10 = 0x202;
    }
    if ((oflag & 8) == 0) {
      local_10 = local_10 | 0x40;
    }
    if ((oflag & 0x20) != 0) {
      local_10 = local_10 & 0xfffffdff;
    }
    if ((oflag & 4) != 0) {
      local_10 = local_10 & 0xfffffdff | 0x400;
    }
  }
  if ((oflag & 0x10) != 0) {
    local_10 = local_10 | 0xc0;
  }
  return local_10;
}

Assistant:

int makeUnixOpenFlags(unsigned int oflag)
{
    int sysFlags = 0;
    if (oflag & File::ofRead)
        sysFlags = O_RDONLY;
    if (oflag & File::ofWrite)
    {
        if (oflag & File::ofRead)
            sysFlags = O_RDWR | O_TRUNC;
        else
            sysFlags = O_WRONLY | O_TRUNC;
        if (!(oflag & File::ofOpenExisting))
            sysFlags |= O_CREAT;
        if (oflag & File::ofNoTruncate)
        {
            sysFlags &= ~O_TRUNC;
        }
        if (oflag & File::ofAppend)
        {
            sysFlags |= O_APPEND;
            sysFlags &= ~O_TRUNC;
        }
    }
    if (oflag & File::ofCreateNew)
        sysFlags |= O_CREAT | O_EXCL;
    return sysFlags;
}